

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_cj(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int b2;
  int d2;
  DisasJumpType DVar4;
  TCGv_i64 cdest;
  DisasCompare_conflict2 local_40;
  
  iVar3 = get_field1(s,FLD_O_m3,FLD_C_i3);
  bVar2 = (byte)ltgt_cond[iVar3];
  local_40._0_1_ = bVar2;
  if ((s->insn->data != 0) &&
     (local_40._0_1_ = bVar2 ^ 6, (0xc3c3UL >> ((long)iVar3 & 0x3fU) & 1) != 0)) {
    local_40._0_1_ = bVar2;
  }
  local_40.g2 = true;
  local_40.is_64 = true;
  local_40.g1 = true;
  local_40.u.s64.a = o->in1;
  local_40.u.s64.b = o->in2;
  uVar1 = (s->fields).presentO;
  if ((uVar1 >> 0x14 & 1) == 0) {
    b2 = get_field1(s,FLD_O_b4,FLD_C_b4);
    d2 = get_field1(s,FLD_O_d4,FLD_C_d4);
    iVar3 = 0;
    cdest = get_address(s,0,b2,d2);
    o->out = cdest;
  }
  else {
    iVar3 = get_field1(s,FLD_O_i4,FLD_C_b4);
    cdest = o->out;
  }
  DVar4 = help_branch(s,&local_40,(_Bool)((byte)(uVar1 >> 0x14) & 1),iVar3,cdest);
  return DVar4;
}

Assistant:

static DisasJumpType op_cj(DisasContext *s, DisasOps *o)
{
    int imm, m3 = get_field(s, m3);
    bool is_imm;
    DisasCompare c;

    c.cond = ltgt_cond[m3];
    if (s->insn->data) {
        c.cond = tcg_unsigned_cond(c.cond);
    }
    c.is_64 = c.g1 = c.g2 = true;
    c.u.s64.a = o->in1;
    c.u.s64.b = o->in2;

    is_imm = have_field(s, i4);
    if (is_imm) {
        imm = get_field(s, i4);
    } else {
        imm = 0;
        o->out = get_address(s, 0, get_field(s, b4),
                             get_field(s, d4));
    }

    return help_branch(s, &c, is_imm, imm, o->out);
}